

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Index __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>
          (FreeList<wabt::interp::Ref> *this,Ref *args)

{
  pointer pRVar1;
  ulong uVar2;
  Index IVar3;
  Ref local_10;
  
  IVar3 = this->free_head_;
  if (IVar3 == 0) {
    local_10 = (Ref)args->index;
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
    emplace_back<wabt::interp::Ref>(&this->list_,&local_10);
    IVar3 = (long)(this->list_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->list_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  else {
    pRVar1 = (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = pRVar1[IVar3 - 1].index;
    if (-1 < (long)uVar2) {
      __assert_fail("!IsUsed(index)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xa0,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    if (this->free_items_ == 0) {
      __assert_fail("free_items_ > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xa1,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    this->free_head_ = uVar2 & 0x7fffffffffffffff;
    pRVar1[IVar3 - 1].index = args->index;
    this->free_items_ = this->free_items_ - 1;
  }
  return IVar3 - 1;
}

Assistant:

auto FreeList<Ref>::New(Args&&... args) -> Index {
  if (free_head_ == 0) {
    list_.push_back(Ref(std::forward<Args>(args)...));
    return list_.size() - 1;
  }

  Index index = free_head_ - 1;

  assert(!IsUsed(index));
  assert(free_items_ > 0);

  free_head_ = list_[index].index & (refFreeBit - 1);
  list_[index] = Ref(std::forward<Args>(args)...);
  free_items_--;
  return index;
}